

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O1

int EstimateStripByteCounts(TIFF *tif,TIFFDirEntry *dir,uint16_t dircount)

{
  long lVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  uint64_t *puVar8;
  uint64_t uVar9;
  toff_t tVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  uint16_t *puVar16;
  long lVar17;
  ulong uVar18;
  
  iVar7 = _TIFFFillStrilesInternal(tif,0);
  iVar13 = -1;
  if (iVar7 != 0) {
    puVar8 = (tif->tif_dir).td_stripbytecount_p;
    if (puVar8 != (uint64_t *)0x0) {
      _TIFFfreeExt(tif,puVar8);
    }
    puVar8 = (uint64_t *)
             _TIFFCheckMalloc(tif,(ulong)(tif->tif_dir).td_nstrips,8,"for \"StripByteCounts\" array"
                             );
    (tif->tif_dir).td_stripbytecount_p = puVar8;
    if (puVar8 != (uint64_t *)0x0) {
      if ((tif->tif_dir).td_compression == 1) {
        if ((tif->tif_flags & 0x400) == 0) {
          uVar9 = TIFFScanlineSize64(tif);
          uVar18 = (ulong)(tif->tif_dir).td_nstrips;
          if (uVar18 != 0) {
            uVar14 = (ulong)(tif->tif_dir).td_imagelength / (ulong)(tif->tif_dir).td_stripsperimage;
            uVar15 = 0;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar9;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = uVar14;
            do {
              if (SUB168(auVar3 * auVar5,8) != 0) {
                return -1;
              }
              (tif->tif_dir).td_stripbytecount_p[uVar15] = uVar9 * uVar14;
              uVar15 = uVar15 + 1;
            } while (uVar18 != uVar15);
          }
        }
        else {
          uVar9 = TIFFTileSize64(tif);
          uVar18 = (ulong)(tif->tif_dir).td_nstrips;
          if (uVar18 != 0) {
            puVar8 = (tif->tif_dir).td_stripbytecount_p;
            uVar14 = 0;
            do {
              puVar8[uVar14] = uVar9;
              uVar14 = uVar14 + 1;
            } while (uVar18 != uVar14);
          }
        }
      }
      else {
        tVar10 = (*tif->tif_sizeproc)(tif->tif_clientdata);
        uVar11 = tif->tif_flags & 0x80000;
        lVar17 = ((ulong)(uVar11 >> 0x10) + 0xc) * (ulong)dircount;
        uVar18 = lVar17 + 0xe;
        if (uVar11 != 0) {
          uVar18 = lVar17 + 0x20;
        }
        if (dircount != 0) {
          puVar16 = &dir->tdir_type;
          do {
            uVar11 = TIFFDataWidth((uint)*puVar16);
            if (uVar11 == 0) {
              bVar2 = false;
              TIFFErrorExtR(tif,"EstimateStripByteCounts",
                            "Cannot determine size of unknown tag type %u");
            }
            else {
              auVar4._8_8_ = 0;
              auVar4._0_8_ = CONCAT44(0,uVar11);
              auVar6._8_8_ = 0;
              auVar6._0_8_ = *(ulong *)(puVar16 + 3);
              if (SUB168(auVar4 * auVar6,8) == 0) {
                uVar15 = *(ulong *)(puVar16 + 3) * CONCAT44(0,uVar11);
                uVar14 = 0;
                if (8 < uVar15) {
                  uVar14 = uVar15;
                }
                uVar12 = 0;
                if (4 < uVar15) {
                  uVar12 = uVar15;
                }
                if ((tif->tif_flags & 0x80000) == 0) {
                  uVar14 = uVar12;
                }
                bVar2 = uVar18 <= ~uVar14;
                if (~uVar14 < uVar18) {
                  uVar14 = 0;
                }
                uVar18 = uVar18 + uVar14;
              }
              else {
                bVar2 = false;
              }
            }
            if (!bVar2) {
              return -1;
            }
            puVar16 = puVar16 + 0x10;
            dircount = dircount - 1;
          } while (dircount != 0);
        }
        uVar14 = 0;
        if (uVar18 <= tVar10) {
          uVar14 = uVar18;
        }
        uVar14 = tVar10 - uVar14;
        if ((tif->tif_dir).td_planarconfig == 2) {
          uVar14 = uVar14 / (tif->tif_dir).td_samplesperpixel;
        }
        uVar18 = (ulong)(tif->tif_dir).td_nstrips;
        if (uVar18 == 0) {
          lVar17 = 0xffffffff;
        }
        else {
          puVar8 = (tif->tif_dir).td_stripbytecount_p;
          lVar17 = -1;
          do {
            puVar8[lVar17 + 1] = uVar14;
            lVar1 = lVar17 - uVar18;
            lVar17 = lVar17 + 1;
          } while (lVar1 != -2);
        }
        puVar8 = (tif->tif_dir).td_stripbytecount_p;
        uVar18 = (tif->tif_dir).td_stripoffset_p[lVar17];
        uVar14 = puVar8[lVar17];
        if (CARRY8(uVar14,uVar18)) {
          return -1;
        }
        if (tVar10 < uVar14 + uVar18) {
          uVar9 = 0;
          if (uVar18 <= tVar10) {
            uVar9 = tVar10 - uVar18;
          }
          puVar8[lVar17] = uVar9;
        }
      }
      uVar11 = (tif->tif_dir).td_fieldsset[0];
      (tif->tif_dir).td_fieldsset[0] = uVar11 | 0x1000000;
      iVar13 = 1;
      if ((uVar11 >> 0x11 & 1) == 0) {
        (tif->tif_dir).td_rowsperstrip = (tif->tif_dir).td_imagelength;
      }
    }
  }
  return iVar13;
}

Assistant:

static int EstimateStripByteCounts(TIFF *tif, TIFFDirEntry *dir,
                                   uint16_t dircount)
{
    static const char module[] = "EstimateStripByteCounts";

    TIFFDirEntry *dp;
    TIFFDirectory *td = &tif->tif_dir;
    uint32_t strip;

    /* Do not try to load stripbytecount as we will compute it */
    if (!_TIFFFillStrilesInternal(tif, 0))
        return -1;

    if (td->td_stripbytecount_p)
        _TIFFfreeExt(tif, td->td_stripbytecount_p);
    td->td_stripbytecount_p = (uint64_t *)_TIFFCheckMalloc(
        tif, td->td_nstrips, sizeof(uint64_t), "for \"StripByteCounts\" array");
    if (td->td_stripbytecount_p == NULL)
        return -1;

    if (td->td_compression != COMPRESSION_NONE)
    {
        uint64_t space;
        uint64_t filesize;
        uint16_t n;
        filesize = TIFFGetFileSize(tif);
        if (!(tif->tif_flags & TIFF_BIGTIFF))
            space = sizeof(TIFFHeaderClassic) + 2 + dircount * 12 + 4;
        else
            space = sizeof(TIFFHeaderBig) + 8 + dircount * 20 + 8;
        /* calculate amount of space used by indirect values */
        for (dp = dir, n = dircount; n > 0; n--, dp++)
        {
            uint32_t typewidth;
            uint64_t datasize;
            typewidth = TIFFDataWidth((TIFFDataType)dp->tdir_type);
            if (typewidth == 0)
            {
                TIFFErrorExtR(
                    tif, module,
                    "Cannot determine size of unknown tag type %" PRIu16,
                    dp->tdir_type);
                return -1;
            }
            if (dp->tdir_count > UINT64_MAX / typewidth)
                return -1;
            datasize = (uint64_t)typewidth * dp->tdir_count;
            if (!(tif->tif_flags & TIFF_BIGTIFF))
            {
                if (datasize <= 4)
                    datasize = 0;
            }
            else
            {
                if (datasize <= 8)
                    datasize = 0;
            }
            if (space > UINT64_MAX - datasize)
                return -1;
            space += datasize;
        }
        if (filesize < space)
            /* we should perhaps return in error ? */
            space = filesize;
        else
            space = filesize - space;
        if (td->td_planarconfig == PLANARCONFIG_SEPARATE)
            space /= td->td_samplesperpixel;
        for (strip = 0; strip < td->td_nstrips; strip++)
            td->td_stripbytecount_p[strip] = space;
        /*
         * This gross hack handles the case were the offset to
         * the last strip is past the place where we think the strip
         * should begin.  Since a strip of data must be contiguous,
         * it's safe to assume that we've overestimated the amount
         * of data in the strip and trim this number back accordingly.
         */
        strip--;
        if (td->td_stripoffset_p[strip] >
            UINT64_MAX - td->td_stripbytecount_p[strip])
            return -1;
        if (td->td_stripoffset_p[strip] + td->td_stripbytecount_p[strip] >
            filesize)
        {
            if (td->td_stripoffset_p[strip] >= filesize)
            {
                /* Not sure what we should in that case... */
                td->td_stripbytecount_p[strip] = 0;
            }
            else
            {
                td->td_stripbytecount_p[strip] =
                    filesize - td->td_stripoffset_p[strip];
            }
        }
    }
    else if (isTiled(tif))
    {
        uint64_t bytespertile = TIFFTileSize64(tif);

        for (strip = 0; strip < td->td_nstrips; strip++)
            td->td_stripbytecount_p[strip] = bytespertile;
    }
    else
    {
        uint64_t rowbytes = TIFFScanlineSize64(tif);
        uint32_t rowsperstrip = td->td_imagelength / td->td_stripsperimage;
        for (strip = 0; strip < td->td_nstrips; strip++)
        {
            if (rowbytes > 0 && rowsperstrip > UINT64_MAX / rowbytes)
                return -1;
            td->td_stripbytecount_p[strip] = rowbytes * rowsperstrip;
        }
    }
    TIFFSetFieldBit(tif, FIELD_STRIPBYTECOUNTS);
    if (!TIFFFieldSet(tif, FIELD_ROWSPERSTRIP))
        td->td_rowsperstrip = td->td_imagelength;
    return 1;
}